

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O1

void __thiscall
spdlog::details::B_formatter::format
          (B_formatter *this,log_msg *param_1,tm *tm_time,memory_buffer *dest)

{
  char *__s;
  size_t wrapped_size;
  ulong uVar1;
  char *buf_ptr;
  ptrdiff_t _Num;
  scoped_pad p;
  scoped_pad sStack_48;
  
  __s = *(char **)(full_months + (long)tm_time->tm_mon * 8);
  wrapped_size = strlen(__s);
  scoped_pad::scoped_pad(&sStack_48,wrapped_size,&(this->super_flag_formatter).padinfo_,dest);
  uVar1 = (dest->super_basic_buffer<char>).size_ + wrapped_size;
  if ((dest->super_basic_buffer<char>).capacity_ < uVar1) {
    (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest,uVar1);
  }
  if (wrapped_size != 0) {
    memmove((dest->super_basic_buffer<char>).ptr_ + (dest->super_basic_buffer<char>).size_,__s,
            wrapped_size);
  }
  (dest->super_basic_buffer<char>).size_ = uVar1;
  scoped_pad::~scoped_pad(&sStack_48);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, fmt::memory_buffer &dest) override
    {
        string_view_t field_value{full_months[tm_time.tm_mon]};
        scoped_pad p(field_value, padinfo_, dest);
        fmt_helper::append_string_view(field_value, dest);
    }